

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

char * rf_pixel_format_string(rf_pixel_format format)

{
  char *pcStack_10;
  rf_pixel_format format_local;
  
  switch(format) {
  case RF_UNCOMPRESSED_GRAYSCALE:
    pcStack_10 = "RF_UNCOMPRESSED_GRAYSCALE";
    break;
  case RF_UNCOMPRESSED_GRAY_ALPHA:
    pcStack_10 = "RF_UNCOMPRESSED_GRAY_ALPHA";
    break;
  case RF_UNCOMPRESSED_R5G6B5:
    pcStack_10 = "RF_UNCOMPRESSED_R5G6B5";
    break;
  case RF_UNCOMPRESSED_R8G8B8:
    pcStack_10 = "RF_UNCOMPRESSED_R8G8B8";
    break;
  case RF_UNCOMPRESSED_R5G5B5A1:
    pcStack_10 = "RF_UNCOMPRESSED_R5G5B5A1";
    break;
  case RF_UNCOMPRESSED_R4G4B4A4:
    pcStack_10 = "RF_UNCOMPRESSED_R4G4B4A4";
    break;
  case RF_UNCOMPRESSED_R8G8B8A8:
    pcStack_10 = "RF_UNCOMPRESSED_R8G8B8A8";
    break;
  case RF_UNCOMPRESSED_R32:
    pcStack_10 = "RF_UNCOMPRESSED_R32";
    break;
  case RF_UNCOMPRESSED_R32G32B32:
    pcStack_10 = "RF_UNCOMPRESSED_R32G32B32";
    break;
  case RF_UNCOMPRESSED_NORMALIZED:
    pcStack_10 = "RF_UNCOMPRESSED_R32G32B32A32";
    break;
  case RF_COMPRESSED_DXT1_RGB:
    pcStack_10 = "RF_COMPRESSED_DXT1_RGB";
    break;
  case RF_COMPRESSED_DXT1_RGBA:
    pcStack_10 = "RF_COMPRESSED_DXT1_RGBA";
    break;
  case RF_COMPRESSED_DXT3_RGBA:
    pcStack_10 = "RF_COMPRESSED_DXT3_RGBA";
    break;
  case RF_COMPRESSED_DXT5_RGBA:
    pcStack_10 = "RF_COMPRESSED_DXT5_RGBA";
    break;
  case RF_COMPRESSED_ETC1_RGB:
    pcStack_10 = "RF_COMPRESSED_ETC1_RGB";
    break;
  case RF_COMPRESSED_ETC2_RGB:
    pcStack_10 = "RF_COMPRESSED_ETC2_RGB";
    break;
  case RF_COMPRESSED_ETC2_EAC_RGBA:
    pcStack_10 = "RF_COMPRESSED_ETC2_EAC_RGBA";
    break;
  case RF_COMPRESSED_PVRT_RGB:
    pcStack_10 = "RF_COMPRESSED_PVRT_RGB";
    break;
  case RF_COMPRESSED_PVRT_RGBA:
    pcStack_10 = "RF_COMPRESSED_PVRT_RGBA";
    break;
  case RF_COMPRESSED_ASTC_4x4_RGBA:
    pcStack_10 = "RF_COMPRESSED_ASTC_4x4_RGBA";
    break;
  case RF_COMPRESSED_ASTC_8x8_RGBA:
    pcStack_10 = "RF_COMPRESSED_ASTC_8x8_RGBA";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

RF_API const char* rf_pixel_format_string(rf_pixel_format format)
{
    switch (format)
    {
        case RF_UNCOMPRESSED_GRAYSCALE: return "RF_UNCOMPRESSED_GRAYSCALE";
        case RF_UNCOMPRESSED_GRAY_ALPHA: return "RF_UNCOMPRESSED_GRAY_ALPHA";
        case RF_UNCOMPRESSED_R5G6B5: return "RF_UNCOMPRESSED_R5G6B5";
        case RF_UNCOMPRESSED_R8G8B8: return "RF_UNCOMPRESSED_R8G8B8";
        case RF_UNCOMPRESSED_R5G5B5A1: return "RF_UNCOMPRESSED_R5G5B5A1";
        case RF_UNCOMPRESSED_R4G4B4A4: return "RF_UNCOMPRESSED_R4G4B4A4";
        case RF_UNCOMPRESSED_R8G8B8A8: return "RF_UNCOMPRESSED_R8G8B8A8";
        case RF_UNCOMPRESSED_R32: return "RF_UNCOMPRESSED_R32";
        case RF_UNCOMPRESSED_R32G32B32: return "RF_UNCOMPRESSED_R32G32B32";
        case RF_UNCOMPRESSED_R32G32B32A32: return "RF_UNCOMPRESSED_R32G32B32A32";
        case RF_COMPRESSED_DXT1_RGB: return "RF_COMPRESSED_DXT1_RGB";
        case RF_COMPRESSED_DXT1_RGBA: return "RF_COMPRESSED_DXT1_RGBA";
        case RF_COMPRESSED_DXT3_RGBA: return "RF_COMPRESSED_DXT3_RGBA";
        case RF_COMPRESSED_DXT5_RGBA: return "RF_COMPRESSED_DXT5_RGBA";
        case RF_COMPRESSED_ETC1_RGB: return "RF_COMPRESSED_ETC1_RGB";
        case RF_COMPRESSED_ETC2_RGB: return "RF_COMPRESSED_ETC2_RGB";
        case RF_COMPRESSED_ETC2_EAC_RGBA: return "RF_COMPRESSED_ETC2_EAC_RGBA";
        case RF_COMPRESSED_PVRT_RGB: return "RF_COMPRESSED_PVRT_RGB";
        case RF_COMPRESSED_PVRT_RGBA: return "RF_COMPRESSED_PVRT_RGBA";
        case RF_COMPRESSED_ASTC_4x4_RGBA: return "RF_COMPRESSED_ASTC_4x4_RGBA";
        case RF_COMPRESSED_ASTC_8x8_RGBA: return "RF_COMPRESSED_ASTC_8x8_RGBA";
        default: return NULL;
    }
}